

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O1

void anon_unknown.dwarf_2c5f86::writeCopyRead
               (string *tempDir,int w,int h,int xs,int ys,int dx,int dy)

{
  ulong *__s;
  ulong *__s_00;
  float fVar1;
  LineOrder LVar2;
  Compression CVar3;
  pointer pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  size_t yst;
  uint uVar8;
  _Alloc_hider _Var9;
  _Alloc_hider _Var10;
  bool bVar11;
  bool bVar12;
  _Rb_tree_color _Var13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  Compression CVar18;
  long lVar19;
  long lVar20;
  ostream *poVar21;
  long *plVar22;
  Compression *pCVar23;
  LineOrder *pLVar24;
  ChannelList *pCVar25;
  half *phVar26;
  Header *pHVar27;
  Box2i *pBVar28;
  long lVar29;
  void *pvVar30;
  void *pvVar31;
  Box2i *pBVar32;
  float *pfVar33;
  V2f *pVVar34;
  V2f *pVVar35;
  ChannelList *pCVar36;
  ulong uVar37;
  ulong *puVar38;
  long lVar39;
  ulong *puVar40;
  ulong *puVar41;
  undefined4 uVar42;
  uint uVar43;
  undefined4 in_register_0000000c;
  void *pvVar44;
  int iVar45;
  void *pvVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  undefined1 uVar51;
  uint uVar52;
  long lVar53;
  Array2D<half> *pAVar54;
  long lVar55;
  long lVar56;
  Array2D<half> *pAVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar70;
  long local_280;
  long local_278;
  Array2D<half> *local_270;
  TiledInputFile in1;
  TiledInputFile in2;
  ulong local_248;
  ulong *local_240;
  FrameBuffer fb;
  ulong *local_208;
  Array2D<half> ph1;
  FrameBuffer fb2;
  Header hdr;
  TiledOutputFile out;
  string filename2;
  string filename1;
  Array<Imf_2_5::Array2D<half>_> levels2;
  Array<Imf_2_5::Array2D<half>_> levels1;
  
  filename1._M_dataplus._M_p = (pointer)&filename1.field_2;
  pcVar4 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename1,pcVar4,pcVar4 + tempDir->_M_string_length,
             CONCAT44(in_register_0000000c,xs),CONCAT44(in_register_00000084,ys),
             CONCAT44(in_register_0000008c,dx));
  std::__cxx11::string::append((char *)&filename1);
  filename2._M_dataplus._M_p = (pointer)&filename2.field_2;
  pcVar4 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename2,pcVar4,pcVar4 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename2);
  _Var13 = w + 0xaa;
  iVar45 = h + 0x102;
  lVar19 = (long)-h;
  lVar20 = (long)-w;
  CVar18 = NO_COMPRESSION;
  do {
    uVar8 = 0;
    do {
      _Var10._M_p = filename1._M_dataplus._M_p;
      _Var9._M_p = filename2._M_dataplus._M_p;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 0, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar21 = (ostream *)std::ostream::operator<<(&std::cout,CVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", roundingMode ",0xf);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", xOffset ",10);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", yOffset ",10);
      plVar22 = (long *)std::ostream::operator<<(poVar21,h);
      std::ios::widen((char)*(undefined8 *)(*plVar22 + -0x18) + (char)plVar22);
      std::ostream::put((char)plVar22);
      std::ostream::flush();
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      out._data = (Data *)0x102000000aa;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var13;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar45;
      Imf_2_5::Header::Header
                (&hdr,(Box2i *)&out,(Box2i *)&fb,1.0,(V2f *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar23 = Imf_2_5::Header::compression(&hdr);
      *pCVar23 = CVar18;
      pLVar24 = Imf_2_5::Header::lineOrder(&hdr);
      *pLVar24 = INCREASING_Y;
      pCVar25 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar25,"H",(Channel *)&out);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x3700000011;
      out._data = (Data *)((ulong)uVar8 << 0x20);
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      ph1._sizeX = 0x103;
      ph1._sizeY = 0xab;
      phVar26 = (half *)operator_new__(0x15a02);
      ph1._data = phVar26;
      fillPixels(&ph1,0xab,0x103);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      bVar12 = SUB41(-w,0);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)(phVar26 + lVar19 * 0xab + lVar20),2,0x156,1,1,0.0,false
                 ,bVar12);
      Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var10._M_p);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile(&out,_Var10._M_p,&hdr,iVar14);
      Imf_2_5::TiledOutputFile::setFrameBuffer(&out,&fb);
      iVar14 = Imf_2_5::TiledOutputFile::numXTiles(&out,0);
      iVar15 = Imf_2_5::TiledOutputFile::numYTiles(&out,0);
      Imf_2_5::TiledOutputFile::writeTiles(&out,0,iVar14 + -1,0,iVar15 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var9._M_p);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&fb,_Var10._M_p,iVar14);
      pHVar27 = Imf_2_5::InputFile::header((InputFile *)&fb);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile(&out,_Var9._M_p,pHVar27,iVar14);
      Imf_2_5::TiledOutputFile::copyPixels(&out,(InputFile *)&fb);
      Imf_2_5::TiledOutputFile::~TiledOutputFile(&out);
      Imf_2_5::InputFile::~InputFile((InputFile *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile(&in1,_Var10._M_p,iVar14);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile(&in2,_Var9._M_p,iVar14);
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar28 = Imf_2_5::Header::dataWindow(pHVar27);
      lVar55 = (long)(pBVar28->min).x;
      lVar48 = (pBVar28->max).x - lVar55;
      uVar37 = lVar48 + 1;
      iVar14 = (pBVar28->min).y;
      iVar15 = (pBVar28->max).y - iVar14;
      uVar52 = iVar15 + 1;
      lVar29 = (long)(int)uVar52 * uVar37;
      uVar47 = lVar29 * 2;
      if (lVar29 < 0) {
        uVar47 = 0xffffffffffffffff;
      }
      pvVar30 = operator_new__(uVar47);
      pvVar31 = operator_new__(uVar47);
      uVar51 = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar29 = (long)-iVar14 * uVar37;
      yst = uVar37 * 2;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)((long)pvVar30 + lVar55 * -2 + lVar29 * 2),2,yst,1,1,0.0
                 ,false,SUB81(fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)((long)pvVar31 + lVar55 * -2 + lVar29 * 2),2,yst,1,1,0.0
                 ,(bool)uVar51,false);
      Imf_2_5::FrameBuffer::insert(&fb2,"H",(Slice *)&out);
      Imf_2_5::TiledInputFile::setFrameBuffer(&in1,&fb);
      iVar14 = Imf_2_5::TiledInputFile::numXTiles(&in1,0);
      iVar16 = Imf_2_5::TiledInputFile::numYTiles(&in1,0);
      Imf_2_5::TiledInputFile::readTiles(&in1,0,iVar14 + -1,0,iVar16 + -1,0);
      Imf_2_5::TiledInputFile::setFrameBuffer(&in2,&fb2);
      iVar14 = Imf_2_5::TiledInputFile::numXTiles(&in2,0);
      iVar16 = Imf_2_5::TiledInputFile::numYTiles(&in2,0);
      uVar42 = 0;
      Imf_2_5::TiledInputFile::readTiles(&in2,0,iVar14 + -1,0,iVar16 + -1,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar28 = Imf_2_5::Header::displayWindow(pHVar27);
      pBVar32 = Imf_2_5::Header::displayWindow(&hdr);
      iVar14 = -(uint)((pBVar32->min).x == (pBVar28->min).x);
      iVar16 = -(uint)((pBVar32->min).y == (pBVar28->min).y);
      auVar58._4_4_ = iVar14;
      auVar58._0_4_ = iVar14;
      auVar58._8_4_ = iVar16;
      auVar58._12_4_ = iVar16;
      iVar14 = movmskpd(uVar42,auVar58);
      if ((iVar14 != 3) ||
         (iVar16 = -(uint)((pBVar32->max).x == (pBVar28->max).x),
         iVar70 = -(uint)((pBVar32->max).y == (pBVar28->max).y), auVar59._4_4_ = iVar16,
         auVar59._0_4_ = iVar16, auVar59._8_4_ = iVar70, auVar59._12_4_ = iVar70,
         iVar16 = movmskpd((int)pBVar32,auVar59), iVar16 != 3)) {
        __assert_fail("in2.header().displayWindow() == hdr.displayWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa0,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar28 = Imf_2_5::Header::dataWindow(pHVar27);
      pBVar32 = Imf_2_5::Header::dataWindow(&hdr);
      iVar16 = -(uint)((pBVar32->min).x == (pBVar28->min).x);
      iVar70 = -(uint)((pBVar32->min).y == (pBVar28->min).y);
      auVar60._4_4_ = iVar16;
      auVar60._0_4_ = iVar16;
      auVar60._8_4_ = iVar70;
      auVar60._12_4_ = iVar70;
      iVar14 = movmskpd(iVar14,auVar60);
      if ((iVar14 != 3) ||
         (iVar14 = -(uint)((pBVar32->max).x == (pBVar28->max).x),
         iVar16 = -(uint)((pBVar32->max).y == (pBVar28->max).y), auVar61._4_4_ = iVar14,
         auVar61._0_4_ = iVar14, auVar61._8_4_ = iVar16, auVar61._12_4_ = iVar16,
         iVar14 = movmskpd((int)pBVar32,auVar61), iVar14 != 3)) {
        __assert_fail("in2.header().dataWindow() == hdr.dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa1,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pfVar33 = Imf_2_5::Header::pixelAspectRatio(pHVar27);
      fVar1 = *pfVar33;
      pfVar33 = Imf_2_5::Header::pixelAspectRatio(&hdr);
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa2,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pVVar34 = Imf_2_5::Header::screenWindowCenter(pHVar27);
      pVVar35 = Imf_2_5::Header::screenWindowCenter(&hdr);
      if ((((pVVar34->x != pVVar35->x) || (NAN(pVVar34->x) || NAN(pVVar35->x))) ||
          (pVVar34->y != pVVar35->y)) || (NAN(pVVar34->y) || NAN(pVVar35->y))) {
        __assert_fail("in2.header().screenWindowCenter() == hdr.screenWindowCenter()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa3,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pfVar33 = Imf_2_5::Header::screenWindowWidth(pHVar27);
      fVar1 = *pfVar33;
      pfVar33 = Imf_2_5::Header::screenWindowWidth(&hdr);
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header().screenWindowWidth() == hdr.screenWindowWidth()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa4,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pLVar24 = Imf_2_5::Header::lineOrder(pHVar27);
      LVar2 = *pLVar24;
      pLVar24 = Imf_2_5::Header::lineOrder(&hdr);
      if (LVar2 != *pLVar24) {
        __assert_fail("in2.header().lineOrder() == hdr.lineOrder()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa5,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pCVar23 = Imf_2_5::Header::compression(pHVar27);
      CVar3 = *pCVar23;
      pCVar23 = Imf_2_5::Header::compression(&hdr);
      if (CVar3 != *pCVar23) {
        __assert_fail("in2.header().compression() == hdr.compression()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa6,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pCVar25 = Imf_2_5::Header::channels(pHVar27);
      pCVar36 = Imf_2_5::Header::channels(&hdr);
      bVar11 = Imf_2_5::ChannelList::operator==(pCVar25,pCVar36);
      if (!bVar11) {
        __assert_fail("in2.header().channels() == hdr.channels()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0xa7,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (-1 < iVar15) {
        uVar47 = 0;
        pvVar44 = pvVar30;
        pvVar46 = pvVar31;
        do {
          if (-1 < (int)lVar48) {
            uVar50 = 0;
            do {
              fVar1 = *(float *)((long)&half::_toFloat +
                                (ulong)*(ushort *)((long)pvVar44 + uVar50 * 2) * 4);
              pfVar33 = (float *)((long)&half::_toFloat +
                                 (ulong)*(ushort *)((long)pvVar46 + uVar50 * 2) * 4);
              if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
                __assert_fail("ph1[y][x] == ph2[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                              ,0xab,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              uVar50 = uVar50 + 1;
            } while ((uVar37 & 0xffffffff) != uVar50);
          }
          uVar47 = uVar47 + 1;
          pvVar46 = (void *)((long)pvVar46 + yst);
          pvVar44 = (void *)((long)pvVar44 + yst);
        } while (uVar47 != uVar52);
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb2);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      operator_delete__(pvVar31);
      operator_delete__(pvVar30);
      Imf_2_5::TiledInputFile::~TiledInputFile(&in2);
      Imf_2_5::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var10._M_p);
      remove(_Var9._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      if (ph1._data != (half *)0x0) {
        operator_delete__(ph1._data);
      }
      Imf_2_5::Header::~Header(&hdr);
      _Var10 = filename1._M_dataplus;
      _Var9 = filename2._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 1, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar21 = (ostream *)std::ostream::operator<<(&std::cout,CVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", roundingMode ",0xf);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", xOffset ",10);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", yOffset ",10);
      plVar22 = (long *)std::ostream::operator<<(poVar21,h);
      std::ios::widen((char)*(undefined8 *)(*plVar22 + -0x18) + (char)plVar22);
      std::ostream::put((char)plVar22);
      std::ostream::flush();
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      out._data = (Data *)0x102000000aa;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var13;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar45;
      Imf_2_5::Header::Header
                (&hdr,(Box2i *)&out,(Box2i *)&fb,1.0,(V2f *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar23 = Imf_2_5::Header::compression(&hdr);
      *pCVar23 = CVar18;
      pLVar24 = Imf_2_5::Header::lineOrder(&hdr);
      *pLVar24 = INCREASING_Y;
      pCVar25 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar25,"H",(Channel *)&out);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x3700000011;
      out._data = (Data *)CONCAT44(uVar8,1);
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      ph1._sizeX = 0;
      ph1._sizeY = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var10._M_p);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var10._M_p,&hdr,iVar14);
      iVar14 = Imf_2_5::TiledOutputFile::numLevels((TiledOutputFile *)&fb2);
      uVar50 = (ulong)iVar14;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar50;
      uVar37 = SUB168(auVar5 * ZEXT816(0x18),0);
      uVar47 = uVar37 + 8;
      if (0xfffffffffffffff7 < uVar37) {
        uVar47 = 0xffffffffffffffff;
      }
      if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
        uVar47 = 0xffffffffffffffff;
      }
      puVar38 = (ulong *)operator_new__(uVar47);
      *puVar38 = uVar50;
      if (iVar14 != 0) {
        memset(puVar38 + 1,0,((uVar50 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      if (ph1._sizeY != 0) {
        lVar29 = *(long *)(ph1._sizeY + -8);
        pvVar30 = (void *)(ph1._sizeY + -8);
        if (lVar29 != 0) {
          lVar48 = lVar29 * 0x18;
          do {
            pvVar31 = *(void **)((long)pvVar30 + lVar48);
            if (pvVar31 != (void *)0x0) {
              operator_delete__(pvVar31);
            }
            lVar48 = lVar48 + -0x18;
          } while (lVar48 != 0);
        }
        operator_delete__(pvVar30,lVar29 * 0x18 + 8);
      }
      lVar48 = 0;
      lVar29 = 0;
      ph1._sizeX = uVar50;
      ph1._sizeY = (long)(puVar38 + 1);
      while( true ) {
        iVar14 = Imf_2_5::TiledOutputFile::numLevels((TiledOutputFile *)&fb2);
        if (iVar14 <= lVar29) break;
        iVar16 = (int)lVar29;
        iVar14 = Imf_2_5::TiledOutputFile::levelWidth((TiledOutputFile *)&fb2,iVar16);
        iVar15 = Imf_2_5::TiledOutputFile::levelHeight((TiledOutputFile *)&fb2,iVar16);
        lVar55 = ph1._sizeY;
        lVar53 = (long)iVar14;
        lVar39 = iVar15 * lVar53;
        uVar37 = lVar39 * 2;
        if (lVar39 < 0) {
          uVar37 = 0xffffffffffffffff;
        }
        pvVar31 = operator_new__(uVar37);
        pvVar30 = *(void **)(lVar55 + 0x10 + lVar48);
        if (pvVar30 != (void *)0x0) {
          operator_delete__(pvVar30);
        }
        *(long *)(lVar55 + lVar48) = (long)iVar15;
        *(long *)(lVar55 + 8 + lVar48) = lVar53;
        *(void **)(lVar55 + 0x10 + lVar48) = pvVar31;
        fillPixels((Array2D<half> *)(ph1._sizeY + lVar48),iVar14,iVar15);
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_2_5::Slice::Slice
                  ((Slice *)&out,HALF,
                   (char *)(*(long *)(ph1._sizeY + 8 + lVar48) * lVar19 * 2 +
                            *(long *)(ph1._sizeY + 0x10 + lVar48) + lVar20 * 2),2,lVar53 * 2,1,1,0.0
                   ,false,bVar12);
        Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
        Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&fb2,&fb);
        iVar14 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&fb2,iVar16);
        iVar15 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&fb2,iVar16);
        Imf_2_5::TiledOutputFile::writeTiles
                  ((TiledOutputFile *)&fb2,0,iVar14 + -1,0,iVar15 + -1,iVar16);
        std::
        _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                     *)&fb);
        lVar29 = lVar29 + 1;
        lVar48 = lVar48 + 0x18;
      }
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var9._M_p);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&fb,_Var10._M_p,iVar14);
      pHVar27 = Imf_2_5::InputFile::header((InputFile *)&fb);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile(&out,_Var9._M_p,pHVar27,iVar14);
      Imf_2_5::TiledOutputFile::copyPixels(&out,(InputFile *)&fb);
      Imf_2_5::TiledOutputFile::~TiledOutputFile(&out);
      Imf_2_5::InputFile::~InputFile((InputFile *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile(&in1,_Var10._M_p,iVar14);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile(&in2,_Var9._M_p,iVar14);
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar28 = Imf_2_5::Header::dataWindow(pHVar27);
      iVar14 = (pBVar28->min).x;
      lVar48 = (long)iVar14;
      iVar15 = (pBVar28->min).y;
      lVar29 = lVar48;
      uVar52 = Imf_2_5::TiledInputFile::numLevels(&in2);
      uVar42 = (undefined4)lVar29;
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::Array(&levels1,(long)(int)uVar52);
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::Array(&levels2,(long)(int)uVar52);
      if (0 < (int)uVar52) {
        lVar29 = -(long)iVar15;
        lVar55 = 0x10;
        uVar37 = 0;
        do {
          iVar70 = (int)uVar37;
          iVar15 = Imf_2_5::TiledInputFile::levelWidth(&in2,iVar70);
          iVar16 = Imf_2_5::TiledInputFile::levelHeight(&in2,iVar70);
          pAVar57 = levels1._data;
          lVar53 = (long)iVar16;
          lVar39 = (long)iVar15;
          uVar47 = lVar53 * lVar39 * 2;
          if (lVar53 * lVar39 < 0) {
            uVar47 = 0xffffffffffffffff;
          }
          pvVar31 = operator_new__(uVar47);
          pvVar30 = *(void **)((long)&pAVar57->_sizeX + lVar55);
          if (pvVar30 != (void *)0x0) {
            operator_delete__(pvVar30);
          }
          pAVar54 = levels2._data;
          *(long *)((long)pAVar57 + lVar55 + -0x10) = lVar53;
          *(long *)((long)pAVar57 + lVar55 + -8) = lVar39;
          *(void **)((long)&pAVar57->_sizeX + lVar55) = pvVar31;
          pvVar31 = operator_new__(uVar47);
          pvVar30 = *(void **)((long)&pAVar54->_sizeX + lVar55);
          if (pvVar30 != (void *)0x0) {
            operator_delete__(pvVar30);
          }
          *(long *)((long)pAVar54 + lVar55 + -0x10) = lVar53;
          *(long *)((long)pAVar54 + lVar55 + -8) = lVar39;
          *(void **)((long)&pAVar54->_sizeX + lVar55) = pvVar31;
          uVar51 = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_2_5::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)levels1._data + lVar55 + -8) * lVar29 * 2 +
                              *(long *)((long)&(levels1._data)->_sizeX + lVar55) + lVar48 * -2),2,
                     lVar39 * 2,1,1,0.0,false,(bool)-(char)iVar14);
          Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
          Imf_2_5::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)levels2._data + lVar55 + -8) * lVar29 * 2 +
                              *(long *)((long)&(levels2._data)->_sizeX + lVar55) + lVar48 * -2),2,
                     lVar39 * 2,1,1,0.0,(bool)uVar51,false);
          Imf_2_5::FrameBuffer::insert(&fb2,"H",(Slice *)&out);
          Imf_2_5::TiledInputFile::setFrameBuffer(&in1,&fb);
          Imf_2_5::TiledInputFile::setFrameBuffer(&in2,&fb2);
          iVar15 = Imf_2_5::TiledInputFile::numXTiles(&in1,iVar70);
          iVar16 = Imf_2_5::TiledInputFile::numYTiles(&in1,iVar70);
          Imf_2_5::TiledInputFile::readTiles(&in1,0,iVar15 + -1,0,iVar16 + -1,iVar70);
          iVar15 = Imf_2_5::TiledInputFile::numXTiles(&in2,iVar70);
          iVar16 = Imf_2_5::TiledInputFile::numYTiles(&in2,iVar70);
          uVar42 = 0;
          Imf_2_5::TiledInputFile::readTiles(&in2,0,iVar15 + -1,0,iVar16 + -1,iVar70);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)&fb2);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)&fb);
          uVar37 = uVar37 + 1;
          lVar55 = lVar55 + 0x18;
        } while (uVar52 != uVar37);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar28 = Imf_2_5::Header::displayWindow(pHVar27);
      pBVar32 = Imf_2_5::Header::displayWindow(&hdr);
      iVar14 = -(uint)((pBVar32->min).x == (pBVar28->min).x);
      iVar15 = -(uint)((pBVar32->min).y == (pBVar28->min).y);
      auVar62._4_4_ = iVar14;
      auVar62._0_4_ = iVar14;
      auVar62._8_4_ = iVar15;
      auVar62._12_4_ = iVar15;
      iVar14 = movmskpd(uVar42,auVar62);
      if ((iVar14 != 3) ||
         (iVar15 = -(uint)((pBVar32->max).x == (pBVar28->max).x),
         iVar16 = -(uint)((pBVar32->max).y == (pBVar28->max).y), auVar63._4_4_ = iVar15,
         auVar63._0_4_ = iVar15, auVar63._8_4_ = iVar16, auVar63._12_4_ = iVar16,
         iVar15 = movmskpd((int)pBVar32,auVar63), iVar15 != 3)) {
        __assert_fail("in2.header().displayWindow() == hdr.displayWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x129,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pBVar28 = Imf_2_5::Header::dataWindow(pHVar27);
      pBVar32 = Imf_2_5::Header::dataWindow(&hdr);
      iVar15 = -(uint)((pBVar32->min).x == (pBVar28->min).x);
      iVar16 = -(uint)((pBVar32->min).y == (pBVar28->min).y);
      auVar64._4_4_ = iVar15;
      auVar64._0_4_ = iVar15;
      auVar64._8_4_ = iVar16;
      auVar64._12_4_ = iVar16;
      iVar14 = movmskpd(iVar14,auVar64);
      if ((iVar14 != 3) ||
         (iVar14 = -(uint)((pBVar32->max).x == (pBVar28->max).x),
         iVar15 = -(uint)((pBVar32->max).y == (pBVar28->max).y), auVar65._4_4_ = iVar14,
         auVar65._0_4_ = iVar14, auVar65._8_4_ = iVar15, auVar65._12_4_ = iVar15,
         iVar14 = movmskpd((int)pBVar32,auVar65), iVar14 != 3)) {
        __assert_fail("in2.header().dataWindow() == hdr.dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x12a,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pfVar33 = Imf_2_5::Header::pixelAspectRatio(pHVar27);
      fVar1 = *pfVar33;
      pfVar33 = Imf_2_5::Header::pixelAspectRatio(&hdr);
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,299,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pVVar34 = Imf_2_5::Header::screenWindowCenter(pHVar27);
      pVVar35 = Imf_2_5::Header::screenWindowCenter(&hdr);
      if ((((pVVar34->x != pVVar35->x) || (NAN(pVVar34->x) || NAN(pVVar35->x))) ||
          (pVVar34->y != pVVar35->y)) || (NAN(pVVar34->y) || NAN(pVVar35->y))) {
        __assert_fail("in2.header().screenWindowCenter() == hdr.screenWindowCenter()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,300,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pfVar33 = Imf_2_5::Header::screenWindowWidth(pHVar27);
      fVar1 = *pfVar33;
      pfVar33 = Imf_2_5::Header::screenWindowWidth(&hdr);
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header().screenWindowWidth() == hdr.screenWindowWidth()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x12d,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pLVar24 = Imf_2_5::Header::lineOrder(pHVar27);
      LVar2 = *pLVar24;
      pLVar24 = Imf_2_5::Header::lineOrder(&hdr);
      if (LVar2 != *pLVar24) {
        __assert_fail("in2.header().lineOrder() == hdr.lineOrder()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x12e,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pCVar23 = Imf_2_5::Header::compression(pHVar27);
      CVar3 = *pCVar23;
      pCVar23 = Imf_2_5::Header::compression(&hdr);
      if (CVar3 != *pCVar23) {
        __assert_fail("in2.header().compression() == hdr.compression()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x12f,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in2);
      pCVar25 = Imf_2_5::Header::channels(pHVar27);
      pCVar36 = Imf_2_5::Header::channels(&hdr);
      bVar12 = Imf_2_5::ChannelList::operator==(pCVar25,pCVar36);
      if (!bVar12) {
        __assert_fail("in2.header().channels() == hdr.channels()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x130,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (0 < (int)uVar52) {
        uVar37 = 0;
        do {
          lVar48 = 0;
          lVar29 = 0;
          while( true ) {
            iVar14 = Imf_2_5::TiledInputFile::levelHeight(&in1,(int)uVar37);
            if (iVar14 <= lVar29) break;
            lVar55 = 0;
            while( true ) {
              iVar14 = Imf_2_5::TiledInputFile::levelWidth(&in1,(int)uVar37);
              if (iVar14 <= lVar55) break;
              fVar1 = *(float *)((long)&half::_toFloat +
                                (ulong)*(unsigned_short *)
                                        ((long)&levels2._data[uVar37]._data[lVar55]._h +
                                        levels2._data[uVar37]._sizeY * lVar48) * 4);
              pfVar33 = (float *)((long)&half::_toFloat +
                                 (ulong)*(unsigned_short *)
                                         ((long)&levels1._data[uVar37]._data[lVar55]._h +
                                         levels1._data[uVar37]._sizeY * lVar48) * 4);
              if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
                __assert_fail("(levels2[l])[y][x] == (levels1[l])[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                              ,0x136,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              if ((CVar18 - DWAA_COMPRESSION < 0xfffffffe) &&
                 ((pfVar33 = (float *)((long)&half::_toFloat +
                                      (ulong)*(ushort *)
                                              (*(long *)(ph1._sizeY + 8 + uVar37 * 0x18) * lVar48 +
                                               *(long *)(ph1._sizeY + 0x10 + uVar37 * 0x18) +
                                              lVar55 * 2) * 4), fVar1 != *pfVar33 ||
                  (NAN(fVar1) || NAN(*pfVar33))))) {
                __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                              ,0x139,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              lVar55 = lVar55 + 1;
            }
            lVar29 = lVar29 + 1;
            lVar48 = lVar48 + 2;
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != uVar52);
      }
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::~Array(&levels2);
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::~Array(&levels1);
      Imf_2_5::TiledInputFile::~TiledInputFile(&in2);
      Imf_2_5::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var10._M_p);
      remove(_Var9._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::~Array((Array<Imf_2_5::Array2D<half>_> *)&ph1);
      Imf_2_5::Header::~Header(&hdr);
      _Var10 = filename1._M_dataplus;
      _Var9 = filename2._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 2, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar21 = (ostream *)std::ostream::operator<<(&std::cout,CVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", roundingMode ",0xf);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", xOffset ",10);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", yOffset ",10);
      plVar22 = (long *)std::ostream::operator<<(poVar21,h);
      std::ios::widen((char)*(undefined8 *)(*plVar22 + -0x18) + (char)plVar22);
      std::ostream::put((char)plVar22);
      std::ostream::flush();
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      out._data = (Data *)0x102000000aa;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var13;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar45;
      Imf_2_5::Header::Header
                (&hdr,(Box2i *)&out,(Box2i *)&fb,1.0,(V2f *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar23 = Imf_2_5::Header::compression(&hdr);
      *pCVar23 = CVar18;
      pLVar24 = Imf_2_5::Header::lineOrder(&hdr);
      *pLVar24 = INCREASING_Y;
      pCVar25 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar25,"H",(Channel *)&out);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x3700000011;
      out._data = (Data *)CONCAT44(uVar8,2);
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var10._M_p);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var10._M_p,&hdr,iVar14);
      iVar14 = Imf_2_5::TiledOutputFile::numYLevels((TiledOutputFile *)&fb2);
      iVar15 = Imf_2_5::TiledOutputFile::numXLevels((TiledOutputFile *)&fb2);
      lVar29 = (long)iVar15;
      uVar50 = iVar14 * lVar29;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar50;
      uVar37 = SUB168(auVar6 * ZEXT816(0x18),0);
      uVar47 = uVar37 + 8;
      if (0xfffffffffffffff7 < uVar37) {
        uVar47 = 0xffffffffffffffff;
      }
      if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
        uVar47 = 0xffffffffffffffff;
      }
      puVar38 = (ulong *)operator_new__(uVar47);
      *puVar38 = uVar50;
      pAVar57 = (Array2D<half> *)(puVar38 + 1);
      if (uVar50 != 0) {
        memset(pAVar57,0,((uVar50 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      local_278 = 0;
      local_270 = pAVar57;
      while( true ) {
        iVar14 = Imf_2_5::TiledOutputFile::numYLevels((TiledOutputFile *)&fb2);
        if (iVar14 <= local_278) break;
        lVar48 = 0;
        pAVar54 = local_270;
        while( true ) {
          iVar14 = Imf_2_5::TiledOutputFile::numXLevels((TiledOutputFile *)&fb2);
          if (iVar14 <= lVar48) break;
          iVar70 = (int)lVar48;
          iVar14 = Imf_2_5::TiledOutputFile::levelWidth((TiledOutputFile *)&fb2,iVar70);
          iVar16 = (int)local_278;
          iVar15 = Imf_2_5::TiledOutputFile::levelHeight((TiledOutputFile *)&fb2,iVar16);
          lVar39 = (long)iVar14;
          lVar55 = iVar15 * lVar39;
          uVar37 = lVar55 * 2;
          if (lVar55 < 0) {
            uVar37 = 0xffffffffffffffff;
          }
          phVar26 = (half *)operator_new__(uVar37);
          if (pAVar54->_data != (half *)0x0) {
            operator_delete__(pAVar54->_data);
          }
          pAVar54->_sizeX = (long)iVar15;
          pAVar54->_sizeY = lVar39;
          pAVar54->_data = phVar26;
          fillPixels(pAVar54,iVar14,iVar15);
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_2_5::Slice::Slice
                    ((Slice *)&out,HALF,(char *)(pAVar54->_data + pAVar54->_sizeY * lVar19 + lVar20)
                     ,2,lVar39 * 2,1,1,0.0,false,SUB81(pAVar54->_data + pAVar54->_sizeY * lVar19,0))
          ;
          Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
          Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&fb2,&fb);
          iVar14 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&fb2,iVar70);
          iVar15 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&fb2,iVar16);
          Imf_2_5::TiledOutputFile::writeTiles
                    ((TiledOutputFile *)&fb2,0,iVar14 + -1,0,iVar15 + -1,iVar70,iVar16);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)&fb);
          lVar48 = lVar48 + 1;
          pAVar54 = pAVar54 + 1;
        }
        local_278 = local_278 + 1;
        local_270 = local_270 + lVar29;
      }
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var9._M_p);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&fb,_Var10._M_p,iVar14);
      pHVar27 = Imf_2_5::InputFile::header((InputFile *)&fb);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile(&out,_Var9._M_p,pHVar27,iVar14);
      Imf_2_5::TiledOutputFile::copyPixels(&out,(InputFile *)&fb);
      Imf_2_5::TiledOutputFile::~TiledOutputFile(&out);
      Imf_2_5::InputFile::~InputFile((InputFile *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&ph1,_Var10._M_p,iVar14);
      iVar14 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile(&in1,_Var9._M_p,iVar14);
      pHVar27 = Imf_2_5::TiledInputFile::header(&in1);
      pBVar28 = Imf_2_5::Header::dataWindow(pHVar27);
      lVar55 = (long)(pBVar28->min).x;
      iVar14 = (pBVar28->min).y;
      uVar52 = Imf_2_5::TiledInputFile::numXLevels(&in1);
      uVar17 = Imf_2_5::TiledInputFile::numYLevels(&in1);
      lVar48 = (long)(int)uVar52;
      uVar47 = (int)uVar17 * lVar48;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar47;
      uVar37 = SUB168(auVar7 * ZEXT816(0x18),0);
      uVar50 = uVar37 + 8;
      if (0xfffffffffffffff7 < uVar37) {
        uVar50 = 0xffffffffffffffff;
      }
      if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
        uVar50 = 0xffffffffffffffff;
      }
      puVar40 = (ulong *)operator_new__(uVar50);
      *puVar40 = uVar47;
      __s = puVar40 + 1;
      if (uVar47 != 0) {
        memset(__s,0,((uVar47 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      puVar41 = (ulong *)operator_new__(uVar50);
      __s_00 = puVar41 + 1;
      *puVar41 = uVar47;
      if (uVar47 != 0) {
        memset(__s_00,0,((uVar47 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      uVar37 = (ulong)uVar17;
      uVar43 = uVar17;
      if (0 < (int)uVar17) {
        lVar39 = -(long)iVar14;
        local_208 = puVar41 + 3;
        local_240 = puVar40 + 3;
        uVar50 = 0;
        uVar47 = uVar37;
        do {
          if (0 < (int)uVar52) {
            local_280 = 0;
            uVar49 = 0;
            do {
              iVar16 = (int)uVar49;
              iVar14 = Imf_2_5::TiledInputFile::levelWidth(&in1,iVar16);
              iVar70 = (int)uVar50;
              iVar15 = Imf_2_5::TiledInputFile::levelHeight(&in1,iVar70);
              lVar56 = (long)iVar15;
              lVar53 = (long)iVar14;
              uVar47 = lVar56 * lVar53 * 2;
              if (lVar56 * lVar53 < 0) {
                uVar47 = 0xffffffffffffffff;
              }
              pvVar30 = operator_new__(uVar47);
              if (*(void **)((long)local_240 + local_280) != (void *)0x0) {
                operator_delete__(*(void **)((long)local_240 + local_280));
              }
              *(long *)((long)local_240 + local_280 + -0x10) = lVar56;
              *(long *)((long)local_240 + local_280 + -8) = lVar53;
              *(void **)((long)local_240 + local_280) = pvVar30;
              pvVar30 = operator_new__(uVar47);
              if (*(void **)((long)local_208 + local_280) != (void *)0x0) {
                operator_delete__(*(void **)((long)local_208 + local_280));
              }
              *(long *)((long)local_208 + local_280 + -0x10) = lVar56;
              *(long *)((long)local_208 + local_280 + -8) = lVar53;
              *(void **)((long)local_208 + local_280) = pvVar30;
              uVar51 = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              lVar56 = *(long *)((long)local_240 + local_280 + -8) * lVar39 * 2 +
                       *(long *)((long)local_240 + local_280);
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_2_5::Slice::Slice
                        ((Slice *)&out,HALF,(char *)(lVar56 + lVar55 * -2),2,lVar53 * 2,1,1,0.0,
                         false,SUB81(lVar56,0));
              Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
              Imf_2_5::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)(*(long *)((long)local_208 + local_280 + -8) * lVar39 * 2 +
                                  *(long *)((long)local_208 + local_280) + lVar55 * -2),2,lVar53 * 2
                         ,1,1,0.0,(bool)uVar51,false);
              Imf_2_5::FrameBuffer::insert(&fb2,"H",(Slice *)&out);
              Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&ph1,&fb);
              Imf_2_5::TiledInputFile::setFrameBuffer(&in1,&fb2);
              iVar14 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&ph1,iVar16);
              iVar15 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&ph1,iVar70);
              Imf_2_5::TiledInputFile::readTiles
                        ((TiledInputFile *)&ph1,0,iVar14 + -1,0,iVar15 + -1,iVar16,iVar70);
              iVar14 = Imf_2_5::TiledInputFile::numXTiles(&in1,iVar16);
              iVar15 = Imf_2_5::TiledInputFile::numYTiles(&in1,iVar70);
              uVar47 = 0;
              Imf_2_5::TiledInputFile::readTiles(&in1,0,iVar14 + -1,0,iVar15 + -1,iVar16,iVar70);
              std::
              _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                           *)&fb2);
              std::
              _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                           *)&fb);
              uVar49 = uVar49 + 1;
              local_280 = local_280 + 0x18;
            } while (uVar52 != uVar49);
          }
          uVar43 = (uint)uVar47;
          uVar50 = uVar50 + 1;
          local_208 = local_208 + lVar48 * 3;
          local_240 = local_240 + lVar48 * 3;
        } while (uVar50 != uVar37);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      pHVar27 = Imf_2_5::TiledInputFile::header(&in1);
      pBVar28 = Imf_2_5::Header::displayWindow(pHVar27);
      pBVar32 = Imf_2_5::Header::displayWindow(&hdr);
      iVar14 = -(uint)((pBVar32->min).x == (pBVar28->min).x);
      iVar15 = -(uint)((pBVar32->min).y == (pBVar28->min).y);
      auVar66._4_4_ = iVar14;
      auVar66._0_4_ = iVar14;
      auVar66._8_4_ = iVar15;
      auVar66._12_4_ = iVar15;
      iVar14 = movmskpd(uVar43,auVar66);
      if ((iVar14 != 3) ||
         (iVar15 = -(uint)((pBVar32->max).x == (pBVar28->max).x),
         iVar16 = -(uint)((pBVar32->max).y == (pBVar28->max).y), auVar67._4_4_ = iVar15,
         auVar67._0_4_ = iVar15, auVar67._8_4_ = iVar16, auVar67._12_4_ = iVar16,
         iVar15 = movmskpd((int)pBVar32,auVar67), iVar15 != 3)) {
        __assert_fail("in2.header().displayWindow() == hdr.displayWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1bf,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in1);
      pBVar28 = Imf_2_5::Header::dataWindow(pHVar27);
      pBVar32 = Imf_2_5::Header::dataWindow(&hdr);
      iVar15 = -(uint)((pBVar32->min).x == (pBVar28->min).x);
      iVar16 = -(uint)((pBVar32->min).y == (pBVar28->min).y);
      auVar68._4_4_ = iVar15;
      auVar68._0_4_ = iVar15;
      auVar68._8_4_ = iVar16;
      auVar68._12_4_ = iVar16;
      iVar14 = movmskpd(iVar14,auVar68);
      if ((iVar14 != 3) ||
         (iVar14 = -(uint)((pBVar32->max).x == (pBVar28->max).x),
         iVar15 = -(uint)((pBVar32->max).y == (pBVar28->max).y), auVar69._4_4_ = iVar14,
         auVar69._0_4_ = iVar14, auVar69._8_4_ = iVar15, auVar69._12_4_ = iVar15,
         iVar14 = movmskpd((int)pBVar32,auVar69), iVar14 != 3)) {
        __assert_fail("in2.header().dataWindow() == hdr.dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c0,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in1);
      pfVar33 = Imf_2_5::Header::pixelAspectRatio(pHVar27);
      fVar1 = *pfVar33;
      pfVar33 = Imf_2_5::Header::pixelAspectRatio(&hdr);
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c1,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in1);
      pVVar34 = Imf_2_5::Header::screenWindowCenter(pHVar27);
      pVVar35 = Imf_2_5::Header::screenWindowCenter(&hdr);
      if ((((pVVar34->x != pVVar35->x) || (NAN(pVVar34->x) || NAN(pVVar35->x))) ||
          (pVVar34->y != pVVar35->y)) || (NAN(pVVar34->y) || NAN(pVVar35->y))) {
        __assert_fail("in2.header().screenWindowCenter() == hdr.screenWindowCenter()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c2,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in1);
      pfVar33 = Imf_2_5::Header::screenWindowWidth(pHVar27);
      fVar1 = *pfVar33;
      pfVar33 = Imf_2_5::Header::screenWindowWidth(&hdr);
      if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
        __assert_fail("in2.header().screenWindowWidth() == hdr.screenWindowWidth()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c3,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in1);
      pLVar24 = Imf_2_5::Header::lineOrder(pHVar27);
      LVar2 = *pLVar24;
      pLVar24 = Imf_2_5::Header::lineOrder(&hdr);
      if (LVar2 != *pLVar24) {
        __assert_fail("in2.header().lineOrder() == hdr.lineOrder()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c4,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in1);
      pCVar23 = Imf_2_5::Header::compression(pHVar27);
      CVar3 = *pCVar23;
      pCVar23 = Imf_2_5::Header::compression(&hdr);
      if (CVar3 != *pCVar23) {
        __assert_fail("in2.header().compression() == hdr.compression()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c5,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      pHVar27 = Imf_2_5::TiledInputFile::header(&in1);
      pCVar25 = Imf_2_5::Header::channels(pHVar27);
      pCVar36 = Imf_2_5::Header::channels(&hdr);
      bVar12 = Imf_2_5::ChannelList::operator==(pCVar25,pCVar36);
      if (!bVar12) {
        __assert_fail("in2.header().channels() == hdr.channels()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                      ,0x1c6,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (0 < (int)uVar17) {
        local_248 = 0;
        do {
          if (0 < (int)uVar52) {
            lVar55 = local_248 * lVar48;
            uVar47 = 0;
            do {
              lVar39 = 0;
              local_280 = 0;
              while( true ) {
                iVar14 = Imf_2_5::TiledInputFile::levelHeight((TiledInputFile *)&ph1,(int)local_248)
                ;
                if (iVar14 <= local_280) break;
                lVar53 = 0;
                while( true ) {
                  iVar14 = Imf_2_5::TiledInputFile::levelWidth((TiledInputFile *)&ph1,(int)uVar47);
                  if (iVar14 <= lVar53) break;
                  fVar1 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)
                                            (__s_00[lVar55 * 3 + uVar47 * 3 + 1] * lVar39 +
                                             __s_00[lVar55 * 3 + uVar47 * 3 + 2] + lVar53 * 2) * 4);
                  pfVar33 = (float *)((long)&half::_toFloat +
                                     (ulong)*(ushort *)
                                             (__s[lVar55 * 3 + uVar47 * 3 + 1] * lVar39 +
                                              __s[lVar55 * 3 + uVar47 * 3 + 2] + lVar53 * 2) * 4);
                  if ((fVar1 != *pfVar33) || (NAN(fVar1) || NAN(*pfVar33))) {
                    __assert_fail("(levels2[ly][lx])[y][x] == (levels1[ly][lx])[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                                  ,0x1ce,
                                  "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                                 );
                  }
                  if ((CVar18 - DWAA_COMPRESSION < 0xfffffffe) &&
                     ((pfVar33 = (float *)((long)&half::_toFloat +
                                          (ulong)*(unsigned_short *)
                                                  ((long)&pAVar57[local_248 * lVar29 + uVar47]._data
                                                          [lVar53]._h +
                                                  pAVar57[local_248 * lVar29 + uVar47]._sizeY *
                                                  lVar39) * 4), fVar1 != *pfVar33 ||
                      (NAN(fVar1) || NAN(*pfVar33))))) {
                    __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                                  ,0x1d2,
                                  "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                                 );
                  }
                  lVar53 = lVar53 + 1;
                }
                local_280 = local_280 + 1;
                lVar39 = lVar39 + 2;
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar52);
          }
          local_248 = local_248 + 1;
        } while (local_248 != uVar37);
      }
      if (__s_00 != (ulong *)0x0) {
        uVar37 = *puVar41;
        if (uVar37 != 0) {
          lVar29 = uVar37 * 0x18;
          do {
            if (*(void **)((long)puVar41 + lVar29) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar41 + lVar29));
            }
            lVar29 = lVar29 + -0x18;
          } while (lVar29 != 0);
        }
        operator_delete__(puVar41,uVar37 * 0x18 + 8);
      }
      if (__s != (ulong *)0x0) {
        uVar37 = *puVar40;
        if (uVar37 != 0) {
          lVar29 = uVar37 * 0x18;
          do {
            if (*(void **)((long)puVar40 + lVar29) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar40 + lVar29));
            }
            lVar29 = lVar29 + -0x18;
          } while (lVar29 != 0);
        }
        operator_delete__(puVar40,uVar37 * 0x18 + 8);
      }
      Imf_2_5::TiledInputFile::~TiledInputFile(&in1);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph1);
      remove(_Var10._M_p);
      remove(_Var9._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      if (pAVar57 != (Array2D<half> *)0x0) {
        uVar37 = *puVar38;
        if (uVar37 != 0) {
          lVar29 = uVar37 * 0x18;
          do {
            if (*(void **)((long)puVar38 + lVar29) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar38 + lVar29));
            }
            lVar29 = lVar29 + -0x18;
          } while (lVar29 != 0);
        }
        operator_delete__(puVar38,uVar37 * 0x18 + 8);
      }
      Imf_2_5::Header::~Header(&hdr);
      bVar12 = uVar8 == 0;
      uVar8 = uVar8 + 1;
    } while (bVar12);
    CVar18 = CVar18 + RLE_COMPRESSION;
    if (CVar18 == NUM_COMPRESSION_METHODS) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename2._M_dataplus._M_p != &filename2.field_2) {
        operator_delete(filename2._M_dataplus._M_p,filename2.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename1._M_dataplus._M_p != &filename1.field_2) {
        operator_delete(filename1._M_dataplus._M_p,filename1.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
writeCopyRead (const std::string &tempDir, int w, int h, int xs, int ys, int dx, int dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
	for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
	{
	    writeCopyReadONE (filename1.c_str(), filename2.c_str(), w, h, xs, ys, dx, dy,
			      Compression (comp), LevelRoundingMode (rmode));

	    writeCopyReadMIP (filename1.c_str(), filename2.c_str(), w, h, xs, ys, dx, dy,
			      Compression (comp), LevelRoundingMode (rmode));
			      
	    writeCopyReadRIP (filename1.c_str(), filename2.c_str(), w, h, xs, ys, dx, dy,
			      Compression (comp), LevelRoundingMode (rmode));
	}
    }
}